

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvAdvDiff_bnd.c
# Opt level: O2

int Jac(sunrealtype t,N_Vector u,N_Vector fu,SUNMatrix J,void *user_data,N_Vector tmp1,N_Vector tmp2
       ,N_Vector tmp3)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  dVar1 = *(double *)((long)user_data + 0x10);
  dVar2 = *(double *)((long)user_data + 0x18);
  dVar3 = *(double *)((long)user_data + 0x20);
  lVar6 = 1;
  lVar7 = 0;
  do {
    if (lVar6 == 6) {
      return 0;
    }
    for (lVar5 = 0; lVar5 != 0x32; lVar5 = lVar5 + 5) {
      pdVar4 = (double *)SUNBandMatrix_Column(J,lVar7 + lVar5);
      *pdVar4 = (dVar1 + dVar3) * -2.0;
      if ((lVar5 == 0) || (pdVar4[-5] = dVar1 + dVar2, lVar5 != 0x2d)) {
        pdVar4[5] = dVar1 - dVar2;
      }
      if (lVar6 == 1) {
LAB_00102b49:
        pdVar4[1] = dVar3;
      }
      else {
        pdVar4[-1] = dVar3;
        if (lVar6 != 5) goto LAB_00102b49;
      }
    }
    lVar6 = lVar6 + 1;
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

static int Jac(sunrealtype t, N_Vector u, N_Vector fu, SUNMatrix J,
               void* user_data, N_Vector tmp1, N_Vector tmp2, N_Vector tmp3)
{
  sunindextype i, j, k;
  sunrealtype *kthCol, hordc, horac, verdc;
  UserData data;

  /*
   * The components of f = udot that depend on u(i,j) are
   * f(i,j), f(i-1,j), f(i+1,j), f(i,j-1), f(i,j+1), with
   *   df(i,j)/du(i,j) = -2 (1/dx^2 + 1/dy^2)
   *   df(i-1,j)/du(i,j) = 1/dx^2 + .25/dx  (if i > 1)
   *   df(i+1,j)/du(i,j) = 1/dx^2 - .25/dx  (if i < MX)
   *   df(i,j-1)/du(i,j) = 1/dy^2           (if j > 1)
   *   df(i,j+1)/du(i,j) = 1/dy^2           (if j < MY)
   */

  data  = (UserData)user_data;
  hordc = data->hdcoef;
  horac = data->hacoef;
  verdc = data->vdcoef;

  SUNDIALS_MARK_BEGIN(data->profobj, "Jac");

  /* set non-zero Jacobian entries */
  for (j = 1; j <= MY; j++)
  {
    for (i = 1; i <= MX; i++)
    {
      k      = j - 1 + (i - 1) * MY;
      kthCol = SUNBandMatrix_Column(J, k);

      /* set the kth column of J */

      SM_COLUMN_ELEMENT_B(kthCol, k, k) = -TWO * (verdc + hordc);
      if (i != 1) { SM_COLUMN_ELEMENT_B(kthCol, k - MY, k) = hordc + horac; }
      if (i != MX) { SM_COLUMN_ELEMENT_B(kthCol, k + MY, k) = hordc - horac; }
      if (j != 1) { SM_COLUMN_ELEMENT_B(kthCol, k - 1, k) = verdc; }
      if (j != MY) { SM_COLUMN_ELEMENT_B(kthCol, k + 1, k) = verdc; }
    }
  }

  SUNDIALS_MARK_END(data->profobj, "Jac");

  return (0);
}